

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

uint8_t get_sprite_pixel(uint8_t *spr_pal,_Bool *spr_behind_bg,_Bool *spr_is_s0,uint16_t dot)

{
  byte bVar1;
  byte bVar2;
  uint8_t i;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 8) {
      return '\0';
    }
    if (((ushort)(~(ushort)sprite_x[lVar3] + dot) < 8) &&
       (bVar2 = 7 - (char)(~(ushort)sprite_x[lVar3] + dot),
       bVar2 = (sprite_low_pattern[lVar3] >> (bVar2 & 0x1f) & 1) != 0 |
               (sprite_high_pattern[lVar3] >> (bVar2 & 0x1f)) * '\x02' & 2, bVar2 != 0)) break;
    lVar3 = lVar3 + 1;
  }
  bVar1 = sprite_attributes[lVar3];
  *spr_pal = bVar1 & 3;
  *spr_behind_bg = (_Bool)(bVar1 >> 5 & 1);
  *spr_is_s0 = (_Bool)(lVar3 == 0 & sprite0_on_current_scanline);
  return bVar2;
}

Assistant:

uint8_t get_sprite_pixel(uint8_t* spr_pal, bool* spr_behind_bg, bool* spr_is_s0, uint16_t dot) {
    uint16_t const pixel = dot - 1;

    for (uint8_t i = 0; i < 8; ++i) {
        uint16_t const offset = pixel - sprite_x[i];
        if (offset < 8) {
            uint8_t pat_res = (NTH_BIT(sprite_high_pattern[i], 7 - offset) << 1) |
                               NTH_BIT(sprite_low_pattern[i], 7 - offset);
            if (pat_res) {
                *spr_pal       = sprite_attributes[i] & 3;
                *spr_behind_bg = sprite_attributes[i] & 0x20;
                *spr_is_s0     = sprite0_on_current_scanline && (i == 0);
                return pat_res;
            }
        }
    }
    return 0;
}